

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

bool __thiscall mario::TimerQueue::insert(TimerQueue *this,Timer *timer)

{
  _Base_ptr p_Var1;
  bool bVar2;
  pair<mario::Timestamp,_mario::Timer_*> local_30;
  
  EventLoop::assertInLoopThread(this->_loop);
  local_30.first._microSecondsSinceEpoch = (timer->_expiration)._microSecondsSinceEpoch;
  p_Var1 = (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((_Rb_tree_header *)p_Var1 == &(this->_timers)._M_t._M_impl.super__Rb_tree_header) ||
     (local_30.first._microSecondsSinceEpoch < *(long *)(p_Var1 + 1))) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  local_30.second = timer;
  std::
  _Rb_tree<std::pair<mario::Timestamp,mario::Timer*>,std::pair<mario::Timestamp,mario::Timer*>,std::_Identity<std::pair<mario::Timestamp,mario::Timer*>>,std::less<std::pair<mario::Timestamp,mario::Timer*>>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>
  ::_M_insert_unique<std::pair<mario::Timestamp,mario::Timer*>>
            ((_Rb_tree<std::pair<mario::Timestamp,mario::Timer*>,std::pair<mario::Timestamp,mario::Timer*>,std::_Identity<std::pair<mario::Timestamp,mario::Timer*>>,std::less<std::pair<mario::Timestamp,mario::Timer*>>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>
              *)&this->_timers,&local_30);
  local_30.second = (Timer *)timer->_sequence;
  local_30.first._microSecondsSinceEpoch = (int64_t)timer;
  std::
  _Rb_tree<std::pair<mario::Timer*,long>,std::pair<mario::Timer*,long>,std::_Identity<std::pair<mario::Timer*,long>>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
  ::_M_insert_unique<std::pair<mario::Timer*,long>>
            ((_Rb_tree<std::pair<mario::Timer*,long>,std::pair<mario::Timer*,long>,std::_Identity<std::pair<mario::Timer*,long>>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
              *)&this->_activeTimers,(pair<mario::Timer_*,_long> *)&local_30);
  return bVar2;
}

Assistant:

bool TimerQueue::insert(Timer* timer) {
    _loop->assertInLoopThread();
    bool earliestChanged = false;
    Timestamp when = timer->expiration();
    auto it = _timers.begin();
    if (it == _timers.end() || when < it->first) {
        earliestChanged = true;
    }

    _timers.insert(std::make_pair(when, timer));
    _activeTimers.insert(ActiveTimer(timer, timer->sequence()));
    return earliestChanged;
}